

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ArenaImpl::SerialArena::AddCleanupFallback
          (SerialArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  CleanupChunk *pCVar1;
  ulong n;
  ulong uVar2;
  size_t sVar3;
  
  do {
    if (this->cleanup_ == (CleanupChunk *)0x0) {
      uVar2 = 8;
    }
    else {
      uVar2 = this->cleanup_->size * 2;
    }
    sVar3 = 0x40;
    if (uVar2 < 0x40) {
      sVar3 = uVar2;
    }
    n = (ulong)(uint)((int)sVar3 << 4) | 0x10;
    pCVar1 = (CleanupChunk *)AllocateAligned(this,n);
    pCVar1->next = this->cleanup_;
    pCVar1->size = sVar3;
    this->cleanup_ = pCVar1;
    this->cleanup_ptr_ = pCVar1->nodes;
    this->cleanup_limit_ = (CleanupNode *)((long)&((CleanupChunk *)(pCVar1->nodes + -1))->size + n);
  } while (uVar2 == 0);
  pCVar1->nodes[0].elem = elem;
  pCVar1->nodes[0].cleanup = cleanup;
  this->cleanup_ptr_ = (CleanupNode *)(pCVar1 + 1);
  return;
}

Assistant:

PROTOBUF_NOINLINE
void ArenaImpl::SerialArena::AddCleanupFallback(void* elem,
                                                void (*cleanup)(void*)) {
  size_t size = cleanup_ ? cleanup_->size * 2 : kMinCleanupListElements;
  size = std::min(size, kMaxCleanupListElements);
  size_t bytes = internal::AlignUpTo8(CleanupChunk::SizeOf(size));
  CleanupChunk* list = reinterpret_cast<CleanupChunk*>(AllocateAligned(bytes));
  list->next = cleanup_;
  list->size = size;

  cleanup_ = list;
  cleanup_ptr_ = &list->nodes[0];
  cleanup_limit_ = &list->nodes[size];

  AddCleanup(elem, cleanup);
}